

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void __thiscall wasm::Fuzzer::run(Fuzzer *this,uint64_t seed)

{
  pointer *this_00;
  ostream *poVar1;
  size_type sVar2;
  result_type rVar3;
  char *pcVar4;
  Fatal *pFVar5;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  Fatal local_c38;
  Error *local_ab0;
  Error *err;
  BuildResult result;
  undefined1 local_a80 [8];
  HeapTypeGenerator generator;
  ulong local_a18;
  size_t i;
  allocator_type local_9f9;
  undefined1 local_9f8 [8];
  vector<char,_std::allocator<char>_> bytes;
  RandEngine getRand;
  uint64_t seed_local;
  Fuzzer *this_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,seed);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running with seed ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,seed);
  std::operator<<(poVar1,"\n");
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_9f8,0x1000,&local_9f9);
  std::allocator<char>::~allocator(&local_9f9);
  local_a18 = 0;
  while( true ) {
    sVar2 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_9f8);
    if (sVar2 <= local_a18) break;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)&bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_9f8);
    *(result_type *)(pcVar4 + local_a18) = rVar3;
    local_a18 = local_a18 + 8;
  }
  Random::Random((Random *)
                 &generator.supertypeIndices.
                  super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<char,_std::allocator<char>_> *)local_9f8);
  this_00 = &generator.supertypeIndices.
             super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Random::operator=(&this->rand,(Random *)this_00);
  Random::~Random((Random *)this_00);
  FeatureSet::FeatureSet
            ((FeatureSet *)
             ((long)&result.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error> +
             0x1c),0x3fffff);
  HeapTypeGenerator::create
            ((HeapTypeGenerator *)local_a80,&this->rand,
             (FeatureSet)
             result.
             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
             .
             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
             .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             _28_4_,0x14);
  wasm::TypeBuilder::build();
  local_ab0 = TypeBuilder::BuildResult::getError((BuildResult *)&err);
  if (local_ab0 != (Error *)0x0) {
    Fatal::Fatal(&local_c38);
    pFVar5 = Fatal::operator<<(&local_c38,(char (*) [24])"Failed to build types: ");
    pFVar5 = Fatal::operator<<(pFVar5,&local_ab0->reason);
    pFVar5 = Fatal::operator<<(pFVar5,(char (*) [11])0x2e7923);
    Fatal::operator<<(pFVar5,&local_ab0->index);
    Fatal::~Fatal(&local_c38);
  }
  __x = TypeBuilder::BuildResult::operator*((BuildResult *)&err);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=(&this->types,__x);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(&this->subtypeIndices,
              (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&generator);
  if ((this->verbose & 1U) != 0) {
    printTypes(&this->types);
  }
  checkSubtypes(this);
  checkLUBs(this);
  checkCanonicalization(this);
  checkInhabitable(this);
  checkRecGroupShapes(this);
  TypeBuilder::BuildResult::~BuildResult((BuildResult *)&err);
  HeapTypeGenerator::~HeapTypeGenerator((HeapTypeGenerator *)local_a80);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_9f8);
  return;
}

Assistant:

void Fuzzer::run(uint64_t seed) {
  // TODO: Reset the global type state to avoid monotonically increasing
  // memory use.
  RandEngine getRand(seed);
  std::cout << "Running with seed " << seed << "\n";

  // 4kb of random bytes should be enough for anyone!
  std::vector<char> bytes(4096);
  for (size_t i = 0; i < bytes.size(); i += sizeof(uint64_t)) {
    *(uint64_t*)(bytes.data() + i) = getRand();
  }
  rand = Random(std::move(bytes));

  // TODO: Options to control the size or set it randomly.
  HeapTypeGenerator generator =
    HeapTypeGenerator::create(rand, FeatureSet::All, 20);
  auto result = generator.builder.build();
  if (auto* err = result.getError()) {
    Fatal() << "Failed to build types: " << err->reason << " at index "
            << err->index;
  }
  types = std::move(*result);
  subtypeIndices = std::move(generator.subtypeIndices);

  if (verbose) {
    printTypes(types);
  }

  checkSubtypes();
  checkLUBs();
  checkCanonicalization();
  checkInhabitable();
  checkRecGroupShapes();
}